

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread.c
# Opt level: O2

void getaddrinfo_do(getaddrinfo_req *req)

{
  int iVar1;
  
  iVar1 = uv_getaddrinfo(req->loop,&req->handle,getaddrinfo_cb,"localhost",0,0);
  if (iVar1 == 0) {
    return;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-thread.c"
          ,0x4a,"r == 0");
  abort();
}

Assistant:

static void getaddrinfo_do(struct getaddrinfo_req* req) {
  int r;

  r = uv_getaddrinfo(req->loop,
                     &req->handle,
                     getaddrinfo_cb,
                     "localhost",
                     NULL,
                     NULL);
  ASSERT(r == 0);
}